

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

GetCommitmentResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetCommitmentRequestStruct,cfd::js::api::GetCommitmentResponseStruct>
          (GetCommitmentResponseStruct *__return_storage_ptr__,api *this,
          GetCommitmentRequestStruct *request,
          function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  GetCommitmentResponseStruct local_128;
  undefined1 local_29;
  function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
  *call_function_local;
  GetCommitmentRequestStruct *request_local;
  GetCommitmentResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = (string *)request;
  call_function_local =
       (function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
        *)this;
  request_local = (GetCommitmentRequestStruct *)__return_storage_ptr__;
  GetCommitmentResponseStruct::GetCommitmentResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
  ::operator()(&local_128,
               (function<cfd::js::api::GetCommitmentResponseStruct_(const_cfd::js::api::GetCommitmentRequestStruct_&)>
                *)request,(GetCommitmentRequestStruct *)call_function_local);
  GetCommitmentResponseStruct::operator=(__return_storage_ptr__,&local_128);
  GetCommitmentResponseStruct::~GetCommitmentResponseStruct(&local_128);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}